

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall Js::InterpreterStackFrame::Setup::SetupInternal(Setup *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  uint uVar5;
  RegSlot RVar6;
  int iVar7;
  uint uVar8;
  void ***pppvVar9;
  void **ppvVar10;
  undefined4 *puVar11;
  uint32 scopeSlots;
  int iStack_1c;
  uint16 envDepth;
  uint forInVarCount;
  uint extraVarCount;
  Type local_10;
  Setup *this_local;
  
  local_10.ptr = (Type *)this;
  bVar3 = ScriptFunction::GetHasInlineCaches(this->function);
  if ((bVar3) &&
     (bVar3 = VarIs<Js::ScriptFunctionWithInlineCache,Js::ScriptFunction>(this->function), bVar3)) {
    VarTo<Js::ScriptFunctionWithInlineCache,Js::ScriptFunction>(this->function);
    ScriptFunctionWithInlineCache::GetInlineCaches((ScriptFunctionWithInlineCache *)&forInVarCount);
    pppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void___((WriteBarrierPtr *)&forInVarCount);
    this->inlineCaches = *pppvVar9;
    if (this->inlineCaches == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x44e,"(this->inlineCaches != nullptr)",
                                  "this->inlineCaches != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  else {
    ppvVar10 = FunctionBody::GetInlineCaches(this->executeFunction);
    this->inlineCaches = ppvVar10;
  }
  uVar5 = FunctionBody::GetInlineCacheCount(this->executeFunction);
  this->inlineCacheCount = uVar5;
  RVar6 = FunctionBody::GetLocalsCount(this->executeFunction);
  this->localCount = RVar6;
  iStack_1c = 0;
  bVar3 = DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction);
  if (bVar3) {
    uVar5 = FunctionBody::GetLoopCount(this->executeFunction);
    iStack_1c = (int)((ulong)uVar5 + 7 >> 3);
  }
  if (((this->bailedOut & 1U) == 0) || ((this->isGeneratorFrame & 1U) != 0)) {
    uVar5 = FunctionBody::GetForInLoopDepth(this->executeFunction);
    iVar7 = uVar5 * 0xb;
  }
  else {
    iVar7 = 0;
  }
  uVar5 = this->localCount;
  RVar6 = FunctionBody::GetOutParamMaxDepth(this->executeFunction);
  uVar8 = FunctionBody::GetInnerScopeCount(this->executeFunction);
  this->varAllocCount = uVar5 + 0x2c + RVar6 + iVar7 + iStack_1c + uVar8;
  this->stackVarAllocCount = 0;
  bVar3 = ParseableFunctionInfo::DoStackNestedFunc
                    (&this->executeFunction->super_ParseableFunctionInfo);
  if ((bVar3) &&
     (uVar5 = ParseableFunctionInfo::GetNestedCount
                        (&this->executeFunction->super_ParseableFunctionInfo), uVar5 != 0)) {
    uVar5 = ParseableFunctionInfo::GetNestedCount
                      (&this->executeFunction->super_ParseableFunctionInfo);
    this->stackVarAllocCount = this->stackVarAllocCount + (int)((ulong)uVar5 * 0x50 >> 3);
    if ((this->bailedOutOfInlinee & 1U) == 0) {
      bVar3 = FunctionBody::DoStackFrameDisplay(this->executeFunction);
      if (bVar3) {
        uVar4 = FunctionBody::GetEnvDepth(this->executeFunction);
        if (uVar4 == 0xffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x474,"(envDepth != (uint16)-1)","envDepth != (uint16)-1");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        this->stackVarAllocCount = this->stackVarAllocCount + uVar4 + 2;
      }
      bVar3 = FunctionBody::DoStackScopeSlots(this->executeFunction);
      if (bVar3) {
        TVar1 = (this->executeFunction->super_ParseableFunctionInfo).scopeSlotArraySize;
        if (TVar1 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x47b,"(scopeSlots != 0)","scopeSlots != 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        this->stackVarAllocCount = TVar1 + 2 + this->stackVarAllocCount;
      }
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::Setup::SetupInternal()
    {
        if (this->function->GetHasInlineCaches() && Js::VarIs<Js::ScriptFunctionWithInlineCache>(this->function))
        {
            this->inlineCaches = (void**)Js::VarTo<Js::ScriptFunctionWithInlineCache>(this->function)->GetInlineCaches();
            Assert(this->inlineCaches != nullptr);
        }
        else
        {
            this->inlineCaches = this->executeFunction->GetInlineCaches();
        }
        this->inlineCacheCount = this->executeFunction->GetInlineCacheCount();

        //
        // Compute the amount of memory needed on the stack:
        // - We compute this in 'Atoms' instead of 'bytes' to keep everything natural word aligned.
        //

        this->localCount = this->executeFunction->GetLocalsCount();
        uint extraVarCount = 0;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction))
        {
            extraVarCount += (sizeof(ImplicitCallFlags) * this->executeFunction->GetLoopCount() + sizeof(Var) - 1) / sizeof(Var);
        }
#endif
        // If we bailed out, we will use the JIT frame's for..in enumerators.
        // But for generators, we will allocate space for them instead.
        uint forInVarCount = (bailedOut && !isGeneratorFrame) ? 0 : (this->executeFunction->GetForInLoopDepth() * (sizeof(Js::ForInObjectEnumerator) / sizeof(Var)));
        this->varAllocCount = k_stackFrameVarCount + localCount + this->executeFunction->GetOutParamMaxDepth() + forInVarCount +
            extraVarCount + this->executeFunction->GetInnerScopeCount();
        this->stackVarAllocCount = 0;

        if (this->executeFunction->DoStackNestedFunc() && this->executeFunction->GetNestedCount() != 0)
        {
            // Track stack funcs...
            this->stackVarAllocCount += (sizeof(StackScriptFunction) * this->executeFunction->GetNestedCount()) / sizeof(Var);
            if (!this->bailedOutOfInlinee)
            {
                // Frame display (if environment depth is statically known)...
                if (this->executeFunction->DoStackFrameDisplay())
                {
                    uint16 envDepth = this->executeFunction->GetEnvDepth();
                    Assert(envDepth != (uint16)-1);
                    this->stackVarAllocCount += sizeof(FrameDisplay) / sizeof(Var) + (envDepth + 1);
                }
                // ...and scope slots (if any)
                if (this->executeFunction->DoStackScopeSlots())
                {
                    uint32 scopeSlots = this->executeFunction->scopeSlotArraySize;
                    Assert(scopeSlots != 0);
                    this->stackVarAllocCount += scopeSlots + Js::ScopeSlots::FirstSlotIndex;
                }
            }
        }
    }